

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O1

void TestConstExpr::ConstCastTestT<signed_char>(void)

{
  if (ConstCastTestT<signed_char>()::b == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::w == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::c == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::sc == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::uc == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::s == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::us == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::i == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::ui == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::l == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::ul == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::ll == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::ull == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::st == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::pt == '\0') {
    ConstCastTestT<signed_char>();
  }
  if (ConstCastTestT<signed_char>()::pl == '\0') {
    ConstCastTestT<signed_char>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}